

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

void __thiscall CFG::addEdge(CFG *this,CfgNode *from,CfgNode *to)

{
  bool bVar1;
  
  if (from != (CfgNode *)0x0) {
    bVar1 = containsNode(this,from);
    if (bVar1) {
      if (to != (CfgNode *)0x0) {
        bVar1 = containsNode(this,to);
        if (bVar1) {
          CfgNode::addSuccessor(from,to);
          CfgNode::addPredecessor(to,from);
          this->m_status = UNCHECKED;
          return;
        }
      }
      __assert_fail("to != 0 && this->containsNode(to)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                    ,0x88,"void CFG::addEdge(CfgNode *, CfgNode *)");
    }
  }
  __assert_fail("from != 0 && this->containsNode(from)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                ,0x87,"void CFG::addEdge(CfgNode *, CfgNode *)");
}

Assistant:

void CFG::addEdge(CfgNode* from, CfgNode* to) {
	assert(from != 0 && this->containsNode(from));
	assert(to != 0 && this->containsNode(to));

	from->addSuccessor(to);
	to->addPredecessor(from);

	m_status = CFG::UNCHECKED;
}